

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::write
          (AbortedRead *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  String local_1d0;
  Exception local_1b8;
  undefined8 local_28;
  AbortedRead *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  this_local = (AbortedRead *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  kj::_::Debug::makeDescription<char_const(&)[28]>
            (&local_1d0,(Debug *)0x9ee498,"abortRead() has been called",(char (*) [28])__n);
  Exception::Exception
            (&local_1b8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x59e,&local_1d0);
  Promise<void>::Promise((Promise<void> *)this,&local_1b8);
  Exception::~Exception(&local_1b8);
  String::~String(&local_1d0);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }